

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

pair_type __thiscall booster::locale::gnu_gettext::mo_file::value(mo_file *this,int id)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  string *in_RDI;
  uint32_t off;
  uint32_t len;
  runtime_error *in_stack_ffffffffffffff90;
  char *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [20];
  uint in_stack_ffffffffffffffcc;
  mo_file *in_stack_ffffffffffffffd0;
  pair_type local_10;
  
  uVar1 = get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  uVar2 = get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (((ulong)uVar2 < *(ulong *)((long)&in_RDI->field_2 + 8)) &&
     ((ulong)(uVar2 + uVar1) < *(ulong *)((long)&in_RDI->field_2 + 8))) {
    local_68 = (char *)((in_RDI->field_2)._M_allocated_capacity + (ulong)uVar2);
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              (&local_10,&local_68,(char **)&stack0xffffffffffffff90);
    return local_10;
  }
  local_5d = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Bad mo-file format",&local_49);
  runtime_error::runtime_error(in_stack_ffffffffffffff90,in_RDI);
  local_5d = 0;
  __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

pair_type value(int id) const
                {
                    uint32_t len = get(translations_offset_ + id*8);
                    uint32_t off = get(translations_offset_ + id*8 + 4);
                    if(off >= file_size_ || off + len >= file_size_)
                        throw booster::runtime_error("Bad mo-file format");
                    return pair_type(&data_[off],&data_[off]+len);
                }